

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O0

void Omega_h::vtk::read_pvtu
               (path *pvtupath,CommPtr *comm,I32 *npieces_out,path *vtupath_out,
               Int *nghost_layers_out)

{
  byte bVar1;
  value_type_conflict *pvVar2;
  path local_2d8;
  path local_2b8;
  shared_ptr<Omega_h::Comm> local_298 [2];
  istream local_278 [8];
  ifstream stream;
  string local_70 [8];
  string vtupath;
  undefined1 local_50 [8];
  path parentpath;
  Int *nghost_layers_out_local;
  path *vtupath_out_local;
  I32 *npieces_out_local;
  CommPtr *comm_local;
  path *pvtupath_local;
  
  parentpath._24_8_ = nghost_layers_out;
  filesystem::path::parent_path((path *)local_50,pvtupath);
  std::__cxx11::string::string(local_70);
  pvVar2 = filesystem::path::c_str(pvtupath);
  std::ifstream::ifstream(local_278,pvVar2,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    pvVar2 = filesystem::path::c_str(pvtupath);
    fail("couldn\'t open \"%s\"\n",pvVar2);
  }
  std::shared_ptr<Omega_h::Comm>::shared_ptr(local_298,comm);
  read_pvtu(local_278,local_298,npieces_out,(string *)local_70,(Int *)parentpath._24_8_);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr(local_298);
  filesystem::path::path(&local_2d8,(string *)local_70);
  filesystem::operator/(&local_2b8,(path *)local_50,&local_2d8);
  filesystem::path::operator=(vtupath_out,&local_2b8);
  filesystem::path::~path(&local_2b8);
  filesystem::path::~path(&local_2d8);
  std::ifstream::~ifstream(local_278);
  std::__cxx11::string::~string(local_70);
  filesystem::path::~path((path *)local_50);
  return;
}

Assistant:

void read_pvtu(filesystem::path const& pvtupath, CommPtr comm, I32* npieces_out,
    filesystem::path* vtupath_out, Int* nghost_layers_out) {
  auto parentpath = pvtupath.parent_path();
  std::string vtupath;
  std::ifstream stream(pvtupath.c_str());
  if (!stream.is_open()) {
    Omega_h_fail("couldn't open \"%s\"\n", pvtupath.c_str());
  }
  read_pvtu(stream, comm, npieces_out, &vtupath, nghost_layers_out);
  *vtupath_out = parentpath / vtupath;
}